

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O3

void __thiscall MetaDCEGraph::dump(MetaDCEGraph *this)

{
  _Hash_node_base *p_Var1;
  size_t sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  char *in_RCX;
  _Base_ptr p_Var8;
  long *plVar9;
  _Hash_node_base *p_Var10;
  undefined8 *puVar11;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  undefined1 local_70 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  importMap;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=== graph ===\n",0xe);
  p_Var10 = (this->roots)._M_h._M_before_begin._M_nxt;
  importMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      poVar5 = (ostream *)p_Var10[1]._M_nxt;
      p_Var1 = p_Var10[2]._M_nxt;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"root: ",6);
      name.super_IString.str._M_str = in_RCX;
      name.super_IString.str._M_len = (size_t)p_Var1;
      poVar5 = wasm::operator<<((wasm *)&std::cout,poVar5,name);
      local_70[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,1);
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  sVar2 = importMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var8 = (_Base_ptr)&importMap;
  importMap._M_t._M_impl._0_4_ = 0;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  plVar9 = *(long **)(importMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xf0);
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var8;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
  if (plVar9 != (long *)0x0) {
    do {
      pmVar6 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)local_70,(key_type *)(plVar9 + 3));
      pcVar4 = (char *)plVar9[2];
      (pmVar6->super_IString).str._M_len = plVar9[1];
      (pmVar6->super_IString).str._M_str = pcVar4;
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  sVar2 = *(size_t *)(sVar2 + 0x10);
  while (sVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"node: ",6);
    name_00.super_IString.str._M_str = (char *)p_Var8;
    name_00.super_IString.str._M_len = *(size_t *)(sVar2 + 0x10);
    poVar5 = wasm::operator<<((wasm *)&std::cout,*(ostream **)(sVar2 + 8),name_00);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
    iVar7 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)local_70,(key_type *)(sVar2 + 8));
    p_Var8 = (_Base_ptr)&importMap;
    if (iVar7._M_node != p_Var8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  is import ",0xc);
      pmVar6 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)local_70,(key_type *)(sVar2 + 8));
      name_01.super_IString.str._M_str = (char *)p_Var8;
      name_01.super_IString.str._M_len = (size_t)(pmVar6->super_IString).str._M_str;
      poVar5 = wasm::operator<<((wasm *)&std::cout,(ostream *)(pmVar6->super_IString).str._M_len,
                                name_01);
      local_31 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
    }
    puVar3 = *(undefined8 **)(sVar2 + 0x30);
    importMap._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar2;
    for (puVar11 = *(undefined8 **)(sVar2 + 0x28); puVar11 != puVar3; puVar11 = puVar11 + 2) {
      poVar5 = (ostream *)*puVar11;
      sVar2 = puVar11[1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  reaches: ",0xb);
      name_02.super_IString.str._M_str = (char *)p_Var8;
      name_02.super_IString.str._M_len = sVar2;
      poVar5 = wasm::operator<<((wasm *)&std::cout,poVar5,name_02);
      local_31 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
    }
    sVar2 = *(size_t *)importMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=============\n",0xe);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_70);
  return;
}

Assistant:

void dump() {
    std::cout << "=== graph ===\n";
    for (auto root : roots) {
      std::cout << "root: " << root << '\n';
    }
    std::map<Name, ImportId> importMap;
    for (auto& [id, dceName] : importIdToDCENode) {
      importMap[dceName] = id;
    }
    for (auto& [name, node] : nodes) {
      std::cout << "node: " << name << '\n';
      if (importMap.find(name) != importMap.end()) {
        std::cout << "  is import " << importMap[name] << '\n';
      }
      for (auto target : node.reaches) {
        std::cout << "  reaches: " << target << '\n';
      }
    }
    std::cout << "=============\n";
  }